

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_predictor_8x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar6 = *(undefined1 (*) [16])left;
  auVar5 = *(undefined1 (*) [16])(left + 8);
  auVar7._0_2_ = auVar6._8_2_ + auVar6._0_2_;
  auVar7._2_2_ = auVar6._10_2_ + auVar6._2_2_;
  auVar7._4_2_ = auVar6._12_2_ + auVar6._4_2_;
  auVar7._6_2_ = auVar6._14_2_ + auVar6._6_2_;
  auVar7._8_2_ = auVar6._8_2_;
  auVar7._10_2_ = auVar6._10_2_;
  auVar7._12_2_ = auVar6._12_2_;
  auVar7._14_2_ = auVar6._14_2_;
  auVar4 = pshuflw(auVar6,auVar7,0xe);
  auVar9._0_2_ = auVar5._8_2_ + auVar5._0_2_;
  auVar9._2_2_ = auVar5._10_2_ + auVar5._2_2_;
  auVar9._4_2_ = auVar5._12_2_ + auVar5._4_2_;
  auVar9._6_2_ = auVar5._14_2_ + auVar5._6_2_;
  auVar9._8_2_ = auVar5._8_2_;
  auVar9._10_2_ = auVar5._10_2_;
  auVar9._12_2_ = auVar5._12_2_;
  auVar9._14_2_ = auVar5._14_2_;
  auVar5 = pshuflw(auVar5,auVar9,0xe);
  auVar6 = *(undefined1 (*) [16])above;
  auVar8._0_2_ = auVar6._8_2_ + auVar6._0_2_;
  auVar8._2_2_ = auVar6._10_2_ + auVar6._2_2_;
  auVar8._4_2_ = auVar6._12_2_ + auVar6._4_2_;
  auVar8._6_2_ = auVar6._14_2_ + auVar6._6_2_;
  auVar8._8_2_ = auVar6._8_2_;
  auVar8._10_2_ = auVar6._10_2_;
  auVar8._12_2_ = auVar6._12_2_;
  auVar8._14_2_ = auVar6._14_2_;
  auVar6 = pshuflw(auVar6,auVar8,0xe);
  auVar6 = ZEXT416(((uint)(ushort)(auVar6._2_2_ + auVar8._2_2_ + auVar6._0_2_ + auVar8._0_2_) +
                    (uint)(ushort)(auVar4._0_2_ + auVar7._0_2_ + auVar5._0_2_ + auVar9._0_2_ +
                                   auVar4._2_2_ + auVar7._2_2_ + auVar5._2_2_ + auVar9._2_2_) + 0xc)
                   / 0x18);
  auVar6 = pshuflw(auVar6,auVar6,0);
  uVar3 = auVar6._0_4_;
  iVar2 = 4;
  do {
    *(undefined4 *)dst = uVar3;
    *(undefined4 *)(dst + 2) = uVar3;
    *(undefined4 *)(dst + 4) = uVar3;
    *(undefined4 *)(dst + 6) = uVar3;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    dst = dst + stride * 4;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_8x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_16(left);
  __m128i sum_above = dc_sum_8(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 12;
  sum32 /= 24;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
  }
}